

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

void __thiscall rsg::BlockStatement::~BlockStatement(BlockStatement *this)

{
  bool bVar1;
  reference ppSVar2;
  __normal_iterator<rsg::Statement_**,_std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>_>
  local_20;
  __normal_iterator<rsg::Statement_**,_std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>_>
  local_18;
  iterator i;
  BlockStatement *this_local;
  
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__BlockStatement_032d9cb0;
  i._M_current = (Statement **)this;
  local_18._M_current =
       (Statement **)
       std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::begin(&this->m_children);
  while( true ) {
    local_20._M_current =
         (Statement **)
         std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::end(&this->m_children);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<rsg::Statement_**,_std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>_>
              ::operator*(&local_18);
    if (*ppSVar2 != (Statement *)0x0) {
      (*(*ppSVar2)->_vptr_Statement[1])();
    }
    __gnu_cxx::
    __normal_iterator<rsg::Statement_**,_std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>_>
    ::operator++(&local_18,0);
  }
  std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::clear(&this->m_children);
  std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::~vector(&this->m_children);
  VariableScope::~VariableScope(&this->m_scope);
  Statement::~Statement(&this->super_Statement);
  return;
}

Assistant:

BlockStatement::~BlockStatement (void)
{
	for (vector<Statement*>::iterator i = m_children.begin(); i != m_children.end(); i++)
		delete *i;
	m_children.clear();
}